

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::CommandPool>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::CommandPool> *this)

{
  Environment *pEVar1;
  int iVar2;
  ulong uVar3;
  VkCommandPoolCreateInfo local_90;
  deUint64 local_78;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)24>_> local_58;
  
  iVar2 = 0;
  uVar3 = 0;
  do {
    if ((int)(uVar3 / 0x14) * 0x14 + iVar2 == 0) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    pEVar1 = this->m_env;
    local_90.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    local_90.pNext = (void *)0x0;
    local_90.flags = this->m_params->flags;
    local_90.queueFamilyIndex = pEVar1->queueFamilyIndex;
    ::vk::createCommandPool
              (&local_58,pEVar1->vkd,pEVar1->device,&local_90,pEVar1->allocationCallbacks);
    local_78 = local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    DStack_70.m_deviceIface =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    DStack_70.m_device =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    DStack_70.m_allocator =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    if (local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&DStack_70,
                 (VkCommandPool)
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
    uVar3 = (ulong)((int)uVar3 + 1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}